

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflowsol.cpp
# Opt level: O2

vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
* __thiscall
ArcflowSol::extract_solution
          (vector<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_std::allocator<std::pair<int,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
           *__return_storage_ptr__,ArcflowSol *this,vector<int,_std::allocator<int>_> *_dem,int T)

{
  _Rb_tree_header *__last;
  pointer pAVar1;
  pointer ppVar2;
  int iVar3;
  pointer piVar4;
  int iVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  mapped_type *pmVar8;
  mapped_type *pmVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  runtime_error *this_00;
  pointer __k;
  pointer __k_00;
  ulong uVar13;
  int v_1;
  int T_local;
  ArcflowSol *local_270;
  int *local_268;
  map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_> *local_260;
  int lbl;
  int *local_250;
  int v;
  _Rb_tree_node_base local_240;
  size_t local_220;
  vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  sol;
  vector<int,_std::allocator<int>_> lst;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> dp;
  map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
  adj;
  set<int,_std::less<int>,_std::allocator<int>_> nodes;
  int u;
  int iStack_134;
  _Vector_base<int,_std::allocator<int>_> local_130 [10];
  
  __last = &nodes._M_t._M_impl.super__Rb_tree_header;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  nodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  adj._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &adj._M_t._M_impl.super__Rb_tree_header._M_header;
  adj._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  adj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  adj._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_260 = &this->flow;
  local_268 = &this->S;
  p_Var7 = (this->flow)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  T_local = T;
  local_270 = this;
  adj._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       adj._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  for (; (_Rb_tree_header *)p_Var7 != &(this->flow)._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    u = p_Var7[1]._M_color;
    v = *(int *)&p_Var7[1].field_0x4;
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&nodes,&u
              );
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&nodes,&v
              );
    if (v != *local_268) {
      pmVar6 = std::
               map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
               ::operator[](&adj,&v);
      std::vector<Arc,_std::allocator<Arc>_>::push_back(pmVar6,(value_type *)(p_Var7 + 1));
    }
  }
  _u = CONCAT44(local_270->S,T_local);
  local_130[0]._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_130[0]._M_impl.super__Vector_impl_data._M_start._4_4_,local_270->LOSS
                        );
  local_250 = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::
              operator[](local_260,(key_type *)&u);
  std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
            ((vector<int,std::allocator<int>> *)&lst,
             (_Rb_tree_const_iterator<int>)
             nodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<int>)__last,(allocator_type *)&u);
  sol.
  super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sol.
  super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  sol.
  super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    local_240._M_color = _S_red;
    local_240._M_parent = (_Base_ptr)0x0;
    local_240._M_left = &local_240;
    local_220 = 0;
    dp._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    dp._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    dp._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &dp._M_t._M_impl.super__Rb_tree_header._M_header;
    dp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    iVar5 = *local_250;
    local_240._M_right = local_240._M_left;
    dp._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         dp._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&dp._M_t,local_268);
    piVar4 = lst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    *pmVar8 = iVar5;
    for (__k = lst.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start; __k != piVar4; __k = __k + 1) {
      pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                           *)&dp._M_t,__k);
      pmVar9 = std::map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>::
               operator[]((map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
                           *)&v,__k);
      pmVar6 = std::
               map<int,_std::vector<Arc,_std::allocator<Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
               ::operator[](&adj,__k);
      pAVar1 = (pmVar6->super__Vector_base<Arc,_std::allocator<Arc>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (__k_00 = (pmVar6->super__Vector_base<Arc,_std::allocator<Arc>_>)._M_impl.
                    super__Vector_impl_data._M_start; __k_00 != pAVar1; __k_00 = __k_00 + 1) {
        sVar10 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 count((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *
                       )&dp._M_t,&__k_00->u);
        if (sVar10 == 0) {
          snprintf((char *)&u,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
                   "dp.count(a.u) != 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflowsol.cpp"
                   ,0x84);
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,(char *)&u);
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        pmVar11 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&dp._M_t,&__k_00->u);
        pmVar12 = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::
                  operator[](local_260,__k_00);
        iVar5 = *pmVar11;
        if (*pmVar12 < *pmVar11) {
          iVar5 = *pmVar12;
        }
        if (*pmVar8 < iVar5) {
          pmVar9->label = __k_00->label;
          iVar3 = __k_00->v;
          pmVar9->u = __k_00->u;
          pmVar9->v = iVar3;
          *pmVar8 = iVar5;
        }
      }
    }
    pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)&dp._M_t,&T_local);
    iVar5 = *pmVar8;
    *local_250 = *local_250 - iVar5;
    if (iVar5 == 0) {
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&dp._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_Arc>,_std::_Select1st<std::pair<const_int,_Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_Arc>,_std::_Select1st<std::pair<const_int,_Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
                   *)&v);
      remove_excess(__return_storage_ptr__,local_270,&sol,_dem);
      std::
      vector<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
      ::~vector(&sol);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&lst.super__Vector_base<int,_std::allocator<int>_>);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Arc,_std::allocator<Arc>_>_>_>_>
      ::~_Rb_tree(&adj._M_t);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&nodes._M_t);
      return __return_storage_ptr__;
    }
    v_1 = T_local;
    _u = _u & 0xffffffff00000000;
    local_130[0]._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_130[0]._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_130[0]._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>
    ::emplace_back<std::pair<int,std::vector<int,std::allocator<int>>>>
              ((vector<std::pair<int,std::vector<int,std::allocator<int>>>,std::allocator<std::pair<int,std::vector<int,std::allocator<int>>>>>
                *)&sol,(pair<int,_std::vector<int,_std::allocator<int>_>_> *)&u);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(local_130);
    sol.
    super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].first = iVar5;
    ppVar2 = sol.
             super__Vector_base<std::pair<int,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<int,_std::vector<int,_std::allocator<int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    uVar13 = (ulong)(uint)v_1;
    while ((int)uVar13 != *local_268) {
      pmVar9 = std::map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>::
               operator[]((map<int,_Arc,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
                           *)&v,&v_1);
      lbl = pmVar9->label;
      local_130[0]._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_130[0]._M_impl.super__Vector_impl_data._M_start._4_4_,lbl);
      uVar13._0_4_ = pmVar9->u;
      uVar13._4_4_ = pmVar9->v;
      _u = uVar13;
      if (lbl != local_270->LOSS) {
        std::vector<int,_std::allocator<int>_>::push_back(&ppVar2->second,&lbl);
      }
      pmVar8 = std::map<Arc,_int,_std::less<Arc>,_std::allocator<std::pair<const_Arc,_int>_>_>::
               operator[](local_260,(key_type *)&u);
      *pmVar8 = *pmVar8 - iVar5;
      v_1 = (undefined4)uVar13;
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&dp._M_t);
    std::
    _Rb_tree<int,_std::pair<const_int,_Arc>,_std::_Select1st<std::pair<const_int,_Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_Arc>,_std::_Select1st<std::pair<const_int,_Arc>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Arc>_>_>
                 *)&v);
  } while( true );
}

Assistant:

std::vector<pattern_pair> ArcflowSol::extract_solution(std::vector<int> *_dem, int T) {
	std::vector<int> &dem = *_dem;
	std::set<int> nodes;
	std::map<int, std::vector<Arc>> adj;
	for (const auto &kvpair : flow) {
		int u = kvpair.first.u;
		int v = kvpair.first.v;
		nodes.insert(u);
		nodes.insert(v);
		if (v != S) {
			adj[v].push_back(kvpair.first);
		}
	}

	int &zflow = flow[Arc(T, S, LOSS)];

	std::vector<int> lst(all(nodes));

	std::vector<pattern_int> sol;
	while (true) {
		std::map<int, Arc> pred;
		std::map<int, int> dp;
		dp[S] = zflow;
		for (const int &v : lst) {
			int &val = dp[v];
			Arc &p = pred[v];
			for (const Arc &a : adj[v]) {
				throw_assert(dp.count(a.u) != 0);
				int mf = std::min(dp[a.u], flow[a]);
				if (mf > val) {
					p = a;
					val = mf;
				}
			}
		}
		int f = dp[T];
		zflow -= f;
		if (f == 0) {
			break;
		}
		int v = T;
		sol.push_back(pattern_int());
		pattern_int &patt = sol.back();
		patt.first = f;
		while (v != S) {
			Arc a = pred[v];
			int u = a.u;
			int lbl = a.label;
			if (lbl != LOSS) {
				patt.second.push_back(lbl);
			}
			flow[a] -= f;
			v = u;
		}
	}
	return remove_excess(sol, &dem);
}